

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

void little_endian_to_native(void *data,char *format)

{
  ushort **ppuVar1;
  char *in_RSI;
  byte *in_RDI;
  int32_t temp;
  uchar *cp;
  byte *local_18;
  char *local_10;
  
  local_18 = in_RDI;
  for (local_10 = in_RSI; *local_10 != '\0'; local_10 = local_10 + 1) {
    if (*local_10 == 'L') {
      *(uint *)local_18 =
           (uint)*local_18 + (uint)local_18[1] * 0x100 + (uint)local_18[2] * 0x10000 +
           (uint)local_18[3] * 0x1000000;
      local_18 = local_18 + 4;
    }
    else if (*local_10 == 'S') {
      *(ushort *)local_18 = (ushort)*local_18 + (ushort)local_18[1] * 0x100;
      local_18 = local_18 + 2;
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)*local_10] & 0x800) != 0) {
        local_18 = local_18 + (*local_10 + -0x30);
      }
    }
  }
  return;
}

Assistant:

void little_endian_to_native (void *data, char *format)
{
    uchar *cp = (uchar *) data;
    int32_t temp;

    while (*format) {
        switch (*format) {
            case 'L':
                temp = cp [0] + ((int32_t) cp [1] << 8) + ((int32_t) cp [2] << 16) + ((int32_t) cp [3] << 24);
                * (int32_t *) cp = temp;
                cp += 4;
                break;

            case 'S':
                temp = cp [0] + (cp [1] << 8);
                * (short *) cp = (short) temp;
                cp += 2;
                break;

            default:
                if (isdigit (*format))
                    cp += *format - '0';

                break;
        }

        format++;
    }
}